

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpphttplibconnector.hpp
# Opt level: O0

void __thiscall
CppHttpLibServerConnector::CppHttpLibServerConnector
          (CppHttpLibServerConnector *this,JsonRpcServer *server,int port)

{
  anon_class_8_1_8991fb9c local_80;
  Handler local_78;
  allocator<char> local_51;
  string local_50;
  int local_1c;
  JsonRpcServer *pJStack_18;
  int port_local;
  JsonRpcServer *server_local;
  CppHttpLibServerConnector *this_local;
  
  this->_vptr_CppHttpLibServerConnector = (_func_int **)&PTR__CppHttpLibServerConnector_00217520;
  (this->thread)._M_id._M_thread = 0;
  local_1c = port;
  pJStack_18 = server;
  server_local = (JsonRpcServer *)this;
  std::thread::thread(&this->thread);
  this->server = pJStack_18;
  httplib::Server::Server(&this->httpServer);
  this->port = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/jsonrpc",&local_51);
  local_80.this = this;
  std::function<void(httplib::Request_const&,httplib::Response&)>::
  function<CppHttpLibServerConnector::CppHttpLibServerConnector(jsonrpccxx::JsonRpcServer&,int)::_lambda(httplib::Request_const&,httplib::Response&)_1_,void>
            ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_78,&local_80);
  httplib::Server::Post(&this->httpServer,&local_50,&local_78);
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

explicit CppHttpLibServerConnector(jsonrpccxx::JsonRpcServer &server, int port) :
    thread(),
    server(server),
    httpServer(),
    port(port) {
    httpServer.Post("/jsonrpc",
		    [this](const httplib::Request &req, httplib::Response &res) {
		      this->PostAction(req, res);
		    });
  }